

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,uint32_t size)

{
  PortPackedStruct *pPVar1;
  initializer_list<unsigned_int> __l;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t local_38;
  allocator_type local_31;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,__l,&local_31);
  pPVar1 = port_packed(this,direction,port_name,packed_struct_,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return pPVar1;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         uint32_t size) {
    return port_packed(direction, port_name, packed_struct_, std::vector<uint32_t>{size});
}